

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::Error(char *m1,char *m2,char *m3,char *m4)

{
  string message;
  allocator local_41;
  char *local_40 [4];
  
  std::__cxx11::string::string((string *)local_40,"CMake Error: ",&local_41);
  if (m1 != (char *)0x0) {
    std::__cxx11::string::append((char *)local_40);
  }
  if (m2 != (char *)0x0) {
    std::__cxx11::string::append((char *)local_40);
  }
  if (m3 != (char *)0x0) {
    std::__cxx11::string::append((char *)local_40);
  }
  if (m4 != (char *)0x0) {
    std::__cxx11::string::append((char *)local_40);
  }
  s_ErrorOccured = true;
  Message(local_40[0],"Error");
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmSystemTools::Error(const char* m1, const char* m2, const char* m3,
                          const char* m4)
{
  std::string message = "CMake Error: ";
  if (m1) {
    message += m1;
  }
  if (m2) {
    message += m2;
  }
  if (m3) {
    message += m3;
  }
  if (m4) {
    message += m4;
  }
  cmSystemTools::s_ErrorOccured = true;
  cmSystemTools::Message(message.c_str(), "Error");
}